

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool testing::internal::MatchPrintAndExplain<std::__cxx11::string_const,std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *matcher,MatchResultListener *listener)

{
  MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *pMVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  StringMatchResultListener inner_listener;
  long *local_208;
  ulong local_200;
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (listener->stream_ != (ostream *)0x0) {
    local_1c0 = (undefined1 *)0x0;
    if (asStack_1b8 != (stringstream *)0x0) {
      local_1c0 = local_1a8;
    }
    local_1c8 = &PTR__StringMatchResultListener_0028b148;
    std::__cxx11::stringstream::stringstream(asStack_1b8);
    pMVar1 = (matcher->
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).impl_.value_;
    iVar2 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar1,value,&local_1c8);
    PrintStringTo(value,listener->stream_);
    GetTypeName<std::__cxx11::string_const>();
    if ((local_200 < 0x15) ||
       (lVar4 = std::__cxx11::string::find_first_of((char *)&local_208,0x21c403,0), lVar4 == -1)) {
      poVar5 = listener->stream_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (of type ",10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_208,local_200);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    }
    std::__cxx11::stringbuf::str();
    poVar5 = listener->stream_;
    iVar3 = std::__cxx11::string::compare((char *)&local_1e8);
    if ((poVar5 != (ostream *)0x0) && (iVar3 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    local_1c8 = &PTR__StringMatchResultListener_0028b148;
    std::__cxx11::stringstream::~stringstream(asStack_1b8);
    std::ios_base::~ios_base(local_138);
    return (bool)(char)iVar2;
  }
  local_1c0 = (undefined1 *)0x0;
  local_1c8 = &PTR__MatchResultListener_0028b090;
  pMVar1 = (matcher->
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).impl_.value_;
  iVar2 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,value);
  return (bool)(char)iVar2;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}